

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

int stbi_write_tga_core(stbi__write_context *s,int x,int y,int comp,void *data)

{
  void *__s1;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  void *__s2;
  undefined4 in_register_00000034;
  char *fmt;
  size_t __n;
  uchar *d;
  int iVar6;
  uint uVar7;
  long lVar8;
  void *pvVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  bool bVar14;
  bool bVar15;
  
  fmt = (char *)CONCAT44(in_register_00000034,x);
  bVar15 = (comp - 2U & 0xfffffffd) == 0;
  uVar7 = (uint)bVar15;
  iVar6 = comp - uVar7;
  if ((y | x) < 0) {
    iVar6 = 0;
  }
  else if (stbi_write_tga_with_rle == 0) {
    iVar6 = stbiw__outfile(s,x,0,x,y,comp,0,data,(uint)bVar15,0,"111 221 2222 11",0,0,
                           (ulong)(iVar6 < 2 | 2),0,0,0,0,0,fmt,(ulong)(uint)y,
                           (ulong)((iVar6 + uVar7) * 8),(ulong)((uint)bVar15 * 8));
  }
  else {
    d = (uchar *)0x0;
    stbiw__writef(s,fmt,0,0,(ulong)(iVar6 < 2 | 10),0,0,0,0,0,fmt,(ulong)(uint)y,
                  (ulong)((iVar6 + uVar7) * 8),(ulong)((uint)bVar15 * 8));
    uVar5 = -(uint)(stbi__flip_vertically_on_write == 0) | y;
    uVar7 = y - 1;
    if (stbi__flip_vertically_on_write != 0) {
      uVar7 = 0;
    }
    if (uVar7 != uVar5) {
      iVar6 = 1;
      if (stbi__flip_vertically_on_write == 0) {
        iVar6 = -1;
      }
      iVar1 = comp * x;
      __n = (size_t)comp;
      iVar3 = uVar7 * iVar1;
      do {
        if (0 < x) {
          iVar13 = 0;
          do {
            __s1 = (void *)((long)data + (long)(iVar13 * comp) + (long)(int)(iVar1 * uVar7));
            if (iVar13 < x + -1) {
              iVar2 = bcmp(__s1,(void *)((long)data +
                                        (long)((iVar13 + 1) * comp) + (long)(int)(iVar1 * uVar7)),
                           __n);
              iVar4 = iVar13 + 2;
              if (iVar2 == 0) {
                bVar14 = true;
                if (x <= iVar4) goto LAB_00138925;
                lVar8 = (long)iVar4;
                pvVar9 = (void *)((long)data + __n * lVar8 + (long)iVar3);
                uVar12 = 2;
                do {
                  lVar8 = lVar8 + 1;
                  iVar2 = bcmp(__s1,pvVar9,__n);
                  uVar11 = uVar12;
                  if ((iVar2 != 0) || (uVar11 = uVar12 + 1, x <= lVar8)) break;
                  pvVar9 = (void *)((long)pvVar9 + __n);
                  bVar14 = uVar12 < 0x7f;
                  uVar12 = uVar11;
                } while (bVar14);
                bVar14 = true;
              }
              else if (iVar4 < x) {
                lVar8 = (long)iVar4;
                __s2 = (void *)((long)data + __n * lVar8 + (long)iVar3);
                pvVar9 = __s1;
                uVar12 = 1;
                do {
                  uVar11 = uVar12;
                  lVar8 = lVar8 + 1;
                  iVar2 = bcmp(pvVar9,__s2,__n);
                  if (iVar2 == 0) goto LAB_00138899;
                  if (x <= lVar8) break;
                  pvVar9 = (void *)((long)pvVar9 + __n);
                  __s2 = (void *)((long)__s2 + __n);
                  uVar12 = uVar11 + 1;
                } while (uVar11 + 1 < 0x7f);
                uVar11 = uVar11 + 2;
LAB_00138899:
                bVar14 = false;
              }
              else {
                bVar14 = false;
LAB_00138925:
                uVar11 = 2;
              }
            }
            else {
              uVar11 = 1;
              bVar14 = false;
            }
            if (bVar14) {
              if (0x40 < s->buf_used + 1U) {
                (*s->func)(s->context,s->buffer,s->buf_used);
                s->buf_used = 0;
              }
              iVar2 = s->buf_used;
              s->buf_used = iVar2 + 1;
              s->buffer[iVar2] = (char)uVar11 + '\x7f';
              stbiw__write_pixel(s,comp,(uint)bVar15,0,(int)__s1,d);
            }
            else {
              if (0x40 < s->buf_used + 1U) {
                (*s->func)(s->context,s->buffer,s->buf_used);
                s->buf_used = 0;
              }
              iVar2 = s->buf_used;
              s->buf_used = iVar2 + 1;
              s->buffer[iVar2] = (char)uVar11 + 0xff;
              if (0 < (int)uVar11) {
                uVar10 = (ulong)uVar11;
                lVar8 = (long)data + (long)(iVar13 * comp) + (long)iVar3;
                do {
                  stbiw__write_pixel(s,comp,(uint)bVar15,0,(int)lVar8,d);
                  lVar8 = lVar8 + __n;
                  uVar10 = uVar10 - 1;
                } while (uVar10 != 0);
              }
            }
            iVar13 = uVar11 + iVar13;
          } while (iVar13 < x);
        }
        uVar7 = uVar7 + iVar6;
        iVar3 = iVar3 + iVar6 * iVar1;
      } while (uVar5 != uVar7);
    }
    iVar6 = 1;
    if (s->buf_used != 0) {
      (*s->func)(s->context,s->buffer,s->buf_used);
      s->buf_used = 0;
    }
  }
  return iVar6;
}

Assistant:

static int stbi_write_tga_core(stbi__write_context *s, int x, int y, int comp, void *data)
{
   int has_alpha = (comp == 2 || comp == 4);
   int colorbytes = has_alpha ? comp-1 : comp;
   int format = colorbytes < 2 ? 3 : 2; // 3 color channels (RGB/RGBA) = 2, 1 color channel (Y/YA) = 3

   if (y < 0 || x < 0)
      return 0;

   if (!stbi_write_tga_with_rle) {
      return stbiw__outfile(s, -1, -1, x, y, comp, 0, (void *) data, has_alpha, 0,
         "111 221 2222 11", 0, 0, format, 0, 0, 0, 0, 0, x, y, (colorbytes + has_alpha) * 8, has_alpha * 8);
   } else {
      int i,j,k;
      int jend, jdir;

      stbiw__writef(s, "111 221 2222 11", 0,0,format+8, 0,0,0, 0,0,x,y, (colorbytes + has_alpha) * 8, has_alpha * 8);

      if (stbi__flip_vertically_on_write) {
         j = 0;
         jend = y;
         jdir = 1;
      } else {
         j = y-1;
         jend = -1;
         jdir = -1;
      }
      for (; j != jend; j += jdir) {
         unsigned char *row = (unsigned char *) data + j * x * comp;
         int len;

         for (i = 0; i < x; i += len) {
            unsigned char *begin = row + i * comp;
            int diff = 1;
            len = 1;

            if (i < x - 1) {
               ++len;
               diff = memcmp(begin, row + (i + 1) * comp, comp);
               if (diff) {
                  const unsigned char *prev = begin;
                  for (k = i + 2; k < x && len < 128; ++k) {
                     if (memcmp(prev, row + k * comp, comp)) {
                        prev += comp;
                        ++len;
                     } else {
                        --len;
                        break;
                     }
                  }
               } else {
                  for (k = i + 2; k < x && len < 128; ++k) {
                     if (!memcmp(begin, row + k * comp, comp)) {
                        ++len;
                     } else {
                        break;
                     }
                  }
               }
            }

            if (diff) {
               unsigned char header = STBIW_UCHAR(len - 1);
               stbiw__write1(s, header);
               for (k = 0; k < len; ++k) {
                  stbiw__write_pixel(s, -1, comp, has_alpha, 0, begin + k * comp);
               }
            } else {
               unsigned char header = STBIW_UCHAR(len - 129);
               stbiw__write1(s, header);
               stbiw__write_pixel(s, -1, comp, has_alpha, 0, begin);
            }
         }
      }
      stbiw__write_flush(s);
   }
   return 1;
}